

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_4,_3> * __thiscall
gl4cts::Math::outerProduct<3,4>
          (Matrix<double,_4,_3> *__return_storage_ptr__,Math *this,Vector<double,_4> *left,
          Vector<double,_3> *right)

{
  undefined1 auVar1 [16];
  int row_1;
  long lVar2;
  Vector<double,_4> *pVVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  undefined1 *puVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  undefined1 auVar10 [16];
  double dVar12;
  undefined8 uVar13;
  Matrix<double,_1,_3> local_b8;
  Matrix<double,_4,_1> local_98;
  undefined1 local_78 [96];
  long lVar11;
  
  auVar1 = _DAT_019f5ce0;
  lVar2 = 0;
  auVar8 = _DAT_019fcc00;
  do {
    bVar9 = SUB164(auVar8 ^ _DAT_019f5ce0,4) == -0x80000000 &&
            SUB164(auVar8 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
    if (bVar9) {
      dVar12 = 1.0;
      if (lVar2 != 0) {
        dVar12 = 0.0;
      }
      local_b8.m_data.m_data[lVar2].m_data[0] = dVar12;
    }
    if (bVar9) {
      local_b8.m_data.m_data[lVar2 + 1].m_data[0] = 0.0;
    }
    lVar2 = lVar2 + 2;
    lVar4 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 2;
    auVar8._8_8_ = lVar4 + 2;
  } while (lVar2 != 4);
  pVVar3 = (__return_storage_ptr__->m_data).m_data;
  pVVar3[2].m_data[2] = 0.0;
  pVVar3[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar3 = (__return_storage_ptr__->m_data).m_data;
  pVVar3[1].m_data[2] = 0.0;
  pVVar3[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  auVar8 = _DAT_019fcc00;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  pVVar3 = (__return_storage_ptr__->m_data).m_data + 1;
  lVar2 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar10 = auVar8;
    do {
      bVar9 = SUB164(auVar10 ^ auVar1,4) == -0x80000000 && SUB164(auVar10 ^ auVar1,0) < -0x7ffffffd;
      if (bVar9) {
        uVar13 = 0x3ff0000000000000;
        if (lVar2 != lVar5) {
          uVar13 = 0;
        }
        *(undefined8 *)
         ((long)((Vector<tcu::Vector<double,_4>,_3> *)(pVVar3 + -1))->m_data[0].m_data + lVar5) =
             uVar13;
      }
      if (bVar9) {
        uVar13 = 0x3ff0000000000000;
        if (lVar2 + -0x20 != lVar5) {
          uVar13 = 0;
        }
        *(undefined8 *)((long)pVVar3->m_data + lVar5) = uVar13;
      }
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
      lVar5 = lVar5 + 0x40;
    } while (lVar5 != 0x80);
    lVar4 = lVar4 + 1;
    lVar2 = lVar2 + 0x20;
    pVVar3 = (Vector<double,_4> *)(pVVar3->m_data + 1);
  } while (lVar4 != 4);
  local_98.m_data.m_data[0].m_data[0] = *(double *)this;
  local_98.m_data.m_data[0].m_data[1] = *(double *)(this + 8);
  local_98.m_data.m_data[0].m_data[2] = *(double *)(this + 0x10);
  local_98.m_data.m_data[0].m_data[3] = *(double *)(this + 0x18);
  local_b8.m_data.m_data[0].m_data[0] = (double  [1])left->m_data[0];
  local_b8.m_data.m_data[1].m_data[0] = (double  [1])left->m_data[1];
  local_b8.m_data.m_data[2].m_data[0] = (double  [1])left->m_data[2];
  puVar7 = local_78;
  tcu::operator*(&local_98,&local_b8);
  lVar2 = 0;
  pdVar6 = (double *)__return_storage_ptr__;
  do {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)pdVar6 + lVar4) = *(undefined8 *)(puVar7 + lVar4);
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0x60);
    lVar2 = lVar2 + 1;
    pdVar6 = pdVar6 + 1;
    puVar7 = puVar7 + 8;
  } while (lVar2 != 4);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}